

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_nblock(Integer g_a,Integer *nblock)

{
  long lVar1;
  short sVar2;
  global_array_t *pgVar3;
  ulong uVar4;
  char err_string [256];
  char acStack_128 [256];
  
  lVar1 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar1)) {
    sprintf(acStack_128,"%s: INVALID ARRAY HANDLE","ga_nblock");
    pnga_error(acStack_128,g_a);
  }
  if (GA[lVar1].actv == 0) {
    sprintf(acStack_128,"%s: ARRAY NOT ACTIVE","ga_nblock");
    pnga_error(acStack_128,g_a);
  }
  pgVar3 = GA;
  sVar2 = GA[lVar1].ndim;
  if (GA[lVar1].distr_type == 0) {
    if (0 < sVar2) {
      uVar4 = 0;
      do {
        nblock[uVar4] = (long)pgVar3[g_a + 1000].nblock[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)(int)sVar2 != uVar4);
    }
  }
  else if (0 < sVar2) {
    uVar4 = 0;
    do {
      nblock[uVar4] = pgVar3[g_a + 1000].num_blocks[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)(int)sVar2 != uVar4);
  }
  return;
}

Assistant:

void pnga_nblock(Integer g_a, Integer *nblock)
{
Integer ga_handle = GA_OFFSET + g_a;
int i, n;

     ga_check_handleM(g_a, "ga_nblock");

     n = GA[ga_handle].ndim;

     if (GA[ga_handle].distr_type == REGULAR) {
       for(i=0; i<n; i++) nblock[i] = (Integer)GA[ga_handle].nblock[i];
     } else {
       for(i=0; i<n; i++) nblock[i] = (Integer)GA[ga_handle].num_blocks[i];
     }
}